

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

int lookup(hash_table_t *table,hash_key_t key,hash_entry_t **entry)

{
  hash_hashvalue_t hVar1;
  int iVar2;
  uint32_t uVar3;
  ulong uVar4;
  hash_entry_t *phVar5;
  ulong uVar6;
  
  hVar1 = (*table->hashfunc)(key);
  uVar4 = (ulong)(long)hVar1 % table->table_size;
  uVar6 = uVar4;
  do {
    uVar3 = table->table[uVar6].status;
    if (uVar3 == 2) {
      phVar5 = table->table + uVar6;
      if (phVar5->hash_value == hVar1) {
        iVar2 = (*table->keycmp)(phVar5->key,key);
        if (iVar2 == 0) {
          *entry = phVar5;
          return 0;
        }
        uVar3 = phVar5->status;
        goto LAB_00222f30;
      }
    }
    else {
LAB_00222f30:
      if (uVar3 == 0) {
        return -1;
      }
    }
    uVar6 = uVar6 + 1;
    if (uVar6 == table->table_size) {
      uVar6 = 0;
    }
    if (uVar6 == uVar4) {
      return -1;
    }
  } while( true );
}

Assistant:

static int lookup(hash_table_t *table, hash_key_t key, hash_entry_t **entry) {
  size_t index = 0, startindex = 0;
  hash_hashvalue_t hashval = 0;

  hashval = table->hashfunc(key);
  index = hashval % table->table_size;
  startindex = index;

  for (;;) {
    hash_entry_t *cur = table->table + index;
    if ((cur->status == INUSE) && (cur->hash_value == hashval) &&
        (table->keycmp(cur->key, key) == 0)) {
      *entry = cur;
      return 0;
    }

    if (cur->status == EMPTY) return -1;
    index++;
    if (index == table->table_size) index = 0;  // GCOVR_EXCL_LINE
    if (index == startindex) return -1;         // GCOVR_EXCL_LINE
  }
}